

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O3

TransactionError node::HandleATMPError(TxValidationState *state,string *err_string_out)

{
  TransactionError TVar1;
  long in_FS_OFFSET;
  bool bVar2;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  ValidationState<TxValidationResult>::ToString_abi_cxx11_
            (&local_40,&state->super_ValidationState<TxValidationResult>);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (err_string_out,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  bVar2 = (state->super_ValidationState<TxValidationResult>).m_result != TX_MISSING_INPUTS;
  TVar1 = MEMPOOL_ERROR;
  if ((state->super_ValidationState<TxValidationResult>).m_mode == M_INVALID) {
    TVar1 = bVar2 + 1 + (uint)bVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return TVar1;
  }
  __stack_chk_fail();
}

Assistant:

static TransactionError HandleATMPError(const TxValidationState& state, std::string& err_string_out)
{
    err_string_out = state.ToString();
    if (state.IsInvalid()) {
        if (state.GetResult() == TxValidationResult::TX_MISSING_INPUTS) {
            return TransactionError::MISSING_INPUTS;
        }
        return TransactionError::MEMPOOL_REJECTED;
    } else {
        return TransactionError::MEMPOOL_ERROR;
    }
}